

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

void __thiscall
LLVMBC::LLVMContext::append_typed_destructor<LLVMBC::Function>(LLVMContext *this,Function *ptr)

{
  TypedDeleter<LLVMBC::Function> *local_18;
  Function *local_10;
  
  local_10 = ptr;
  local_18 = construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::Function>,LLVMBC::Function*&>
                       (this,&local_10);
  std::
  vector<LLVMBC::LLVMContext::Deleter*,dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter*>>
  ::emplace_back<LLVMBC::LLVMContext::Deleter*>
            ((vector<LLVMBC::LLVMContext::Deleter*,dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter*>>
              *)&this->typed_allocations,(Deleter **)&local_18);
  return;
}

Assistant:

void append_typed_destructor(T *ptr)
	{
		typed_allocations.push_back(construct_trivial<TypedDeleter<T>>(ptr));
	}